

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O0

_Bool chck_lut_set(chck_lut *lut,uint32_t lookup,void *data)

{
  _Bool _Var1;
  uint32_t uVar2;
  void *data_local;
  uint32_t lookup_local;
  chck_lut *lut_local;
  
  if ((lut != (chck_lut *)0x0) && (lut->hashuint != (_func_uint32_t_uint32_t *)0x0)) {
    uVar2 = (*lut->hashuint)(lookup);
    _Var1 = lut_set_index(lut,(uint32_t)((ulong)uVar2 % lut->count),data);
    return _Var1;
  }
  __assert_fail("lut && lut->hashuint",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                0x6d,"_Bool chck_lut_set(struct chck_lut *, uint32_t, const void *)");
}

Assistant:

bool
chck_lut_set(struct chck_lut *lut, uint32_t lookup, const void *data)
{
   assert(lut && lut->hashuint);
   return lut_set_index(lut, lut->hashuint(lookup) % lut->count, data);
}